

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O0

undefined8 BoundedType::Bind(BindLogicalTypeInput *input)

{
  bool bVar1;
  size_type sVar2;
  BinderException *pBVar3;
  const_reference pvVar4;
  long in_RSI;
  undefined8 in_RDI;
  int32_t bound_val;
  vector<duckdb::Value,_true> *modifiers;
  LogicalType *in_stack_fffffffffffffee8;
  LogicalType *in_stack_fffffffffffffef0;
  allocator local_b1;
  string local_b0 [38];
  undefined1 local_8a;
  allocator local_89;
  string local_88 [32];
  LogicalType local_68 [4];
  int32_t in_stack_ffffffffffffff9c;
  allocator local_39;
  string local_38 [32];
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *local_18;
  
  local_18 = *(vector<duckdb::Value,_std::allocator<duckdb::Value>_> **)(in_RSI + 0x10);
  sVar2 = std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::size(local_18);
  if (sVar2 != 1) {
    pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"BOUNDED type must have one modifier",&local_39);
    duckdb::BinderException::BinderException(pBVar3,local_38);
    __cxa_throw(pBVar3,&duckdb::BinderException::typeinfo,duckdb::BinderException::~BinderException)
    ;
  }
  pvVar4 = duckdb::vector<duckdb::Value,_true>::operator[]
                     ((vector<duckdb::Value,_true> *)in_stack_fffffffffffffef0,
                      (size_type)in_stack_fffffffffffffee8);
  duckdb::Value::type(pvVar4);
  duckdb::LogicalType::LogicalType(local_68,INTEGER);
  bVar1 = duckdb::LogicalType::operator!=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  duckdb::LogicalType::~LogicalType(local_68);
  if (!bVar1) {
    pvVar4 = duckdb::vector<duckdb::Value,_true>::operator[]
                       ((vector<duckdb::Value,_true> *)in_stack_fffffffffffffef0,
                        (size_type)in_stack_fffffffffffffee8);
    bVar1 = duckdb::Value::IsNull(pvVar4);
    if (!bVar1) {
      duckdb::vector<duckdb::Value,_true>::operator[]
                ((vector<duckdb::Value,_true> *)in_stack_fffffffffffffef0,
                 (size_type)in_stack_fffffffffffffee8);
      duckdb::Value::GetValue<int>();
      Get(in_stack_ffffffffffffff9c);
      return in_RDI;
    }
    pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"BOUNDED type modifier cannot be NULL",&local_b1);
    duckdb::BinderException::BinderException(pBVar3,local_b0);
    __cxa_throw(pBVar3,&duckdb::BinderException::typeinfo,duckdb::BinderException::~BinderException)
    ;
  }
  local_8a = 1;
  pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"BOUNDED type modifier must be integer",&local_89);
  duckdb::BinderException::BinderException(pBVar3,local_88);
  local_8a = 0;
  __cxa_throw(pBVar3,&duckdb::BinderException::typeinfo,duckdb::BinderException::~BinderException);
}

Assistant:

static LogicalType Bind(const BindLogicalTypeInput &input) {
		auto &modifiers = input.modifiers;

		if (modifiers.size() != 1) {
			throw BinderException("BOUNDED type must have one modifier");
		}
		if (modifiers[0].type() != LogicalType::INTEGER) {
			throw BinderException("BOUNDED type modifier must be integer");
		}
		if (modifiers[0].IsNull()) {
			throw BinderException("BOUNDED type modifier cannot be NULL");
		}
		auto bound_val = modifiers[0].GetValue<int32_t>();
		return Get(bound_val);
	}